

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::to_model_mode(Application *this)

{
  bool bVar1;
  iterator this_00;
  reference ppSVar2;
  Mesh *this_01;
  long in_RDI;
  Mesh *m;
  SceneObject *o;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *in_stack_ffffffffffffffb8;
  PathTracer *in_stack_ffffffffffffffc0;
  PathTracer *in_stack_ffffffffffffffd0;
  PathTracer *in_stack_ffffffffffffffd8;
  undefined1 isGhosted;
  _Self local_18;
  long local_10;
  
  if (*(int *)(in_RDI + 0xc) != 0) {
    PathTracer::stop(in_stack_ffffffffffffffd0);
    PathTracer::clear(in_stack_ffffffffffffffc0);
    DynamicScene::Selection::clear((Selection *)in_stack_ffffffffffffffd0);
    local_10 = *(long *)(in_RDI + 0x50) + 0x98;
    local_18._M_node =
         (_Base_ptr)
         std::
         set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
         ::begin(in_stack_ffffffffffffffb8);
    this_00 = std::
              set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
              ::end(in_stack_ffffffffffffffb8);
    while( true ) {
      isGhosted = (undefined1)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
      bVar1 = std::operator!=(&local_18,(_Self *)&stack0xffffffffffffffe0);
      if (!bVar1) break;
      ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                          ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                           in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc0 = (PathTracer *)*ppSVar2;
      in_stack_ffffffffffffffd8 = in_stack_ffffffffffffffc0;
      if (in_stack_ffffffffffffffc0 == (PathTracer *)0x0) {
        this_01 = (Mesh *)0x0;
      }
      else {
        this_01 = (Mesh *)__dynamic_cast(in_stack_ffffffffffffffc0,
                                         &DynamicScene::SceneObject::typeinfo,
                                         &DynamicScene::Mesh::typeinfo,0);
      }
      if (this_01 != (Mesh *)0x0) {
        DynamicScene::Mesh::resetWave(this_01);
        reset_vertex_positions
                  ((Mesh *)this_00._M_node,SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0));
      }
      std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++
                ((_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*> *)
                 in_stack_ffffffffffffffc0);
    }
    *(undefined4 *)(in_RDI + 0xc) = 0;
    *(undefined4 *)(in_RDI + 0x10) = 0;
    setGhosted((Application *)this_00._M_node,(bool)isGhosted);
  }
  return;
}

Assistant:

void Application::to_model_mode() {
  if (mode == MODEL_MODE) return;
  pathtracer->stop();
  pathtracer->clear();
  scene->selected.clear();

  for (auto o : scene->objects) {
    DynamicScene::Mesh *m = dynamic_cast<DynamicScene::Mesh *>(o);
    if (m != nullptr) {  // Mesh
      m->resetWave();

      reset_vertex_positions(m, false);
    }
  }

  mode = MODEL_MODE;

  action = Action::Navigate;
  setGhosted(false);
}